

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

bool ASDCP::MXF::decode_mca_string
               (string *s,mca_label_map_t *labels,Dictionary *dict,string *language,
               InterchangeObject_list_t *descriptor_list,ui32_t *channel_count)

{
  size_t *psVar1;
  uint uVar2;
  undefined8 uVar3;
  InterchangeObject_list_t *pIVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  SoundfieldGroupLabelSubDescriptor *pSVar9;
  const_iterator cVar10;
  AudioChannelLabelSubDescriptor *pAVar11;
  _List_node_base *p_Var12;
  ILogSink *pIVar13;
  key_type *__k;
  char *pcVar14;
  char *pcVar15;
  char cVar16;
  sfg_map_t used_soundfields;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  SoundfieldGroupLabelSubDescriptor *local_d8;
  key_type local_d0;
  uint *local_b0;
  string *local_a8;
  InterchangeObject_list_t *local_a0;
  Dictionary *local_98;
  _Base_ptr local_90;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
  *local_88;
  string local_80;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
  local_60;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  *channel_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = channel_count;
  local_a8 = language;
  local_a0 = descriptor_list;
  local_98 = dict;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (s->_M_string_length == 0) {
    bVar5 = true;
    goto LAB_001a9044;
  }
  pcVar15 = (s->_M_dataplus)._M_p;
  local_90 = &(labels->_M_t)._M_impl.super__Rb_tree_header._M_header;
  pSVar9 = (SoundfieldGroupLabelSubDescriptor *)0x0;
  local_d8 = (SoundfieldGroupLabelSubDescriptor *)0x0;
  local_88 = &labels->_M_t;
LAB_001a8661:
  cVar16 = *pcVar15;
  switch(cVar16) {
  case '(':
    if (pSVar9 != (SoundfieldGroupLabelSubDescriptor *)0x0) {
      if (local_d0._M_string_length == 0) break;
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar15 = "Encountered \'(\', already processing a soundfield group.\n";
      goto LAB_001a8f8a;
    }
    if (local_d0._M_string_length != 0) {
      __k = &local_d0;
      cVar10 = std::
               _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
               ::find(local_88,__k);
      if (cVar10._M_node == local_90) {
        pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar15 = "Unknown symbol: \'%s\'\n";
      }
      else {
        if (*(char *)((long)&cVar10._M_node[3]._M_right + 3) == '\x02') {
          iVar8 = std::
                  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
                  ::find(&local_60,__k);
          if ((_Rb_tree_header *)iVar8._M_node == &local_60._M_impl.super__Rb_tree_header) {
            pSVar9 = (SoundfieldGroupLabelSubDescriptor *)operator_new(0x318);
            SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor(pSVar9,local_98);
            Kumu::GenRandomValue(&(pSVar9->super_MCALabelSubDescriptor).MCALinkID);
            pcVar14 = "";
            if ((char)cVar10._M_node[3]._M_color != _S_red) {
              pcVar14 = "sg";
            }
            local_d8 = pSVar9;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,pcVar14,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (cVar10._M_node + 1));
            UTF16String::operator=
                      (&(local_d8->super_MCALabelSubDescriptor).MCATagSymbol,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
            }
            UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar10._M_node + 2));
            pSVar9 = local_d8;
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(local_d8->super_MCALabelSubDescriptor).MCATagName.m_property.super_string);
            (pSVar9->super_MCALabelSubDescriptor).MCATagName.m_has_value = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._8_8_ != &local_e8) {
              operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
            }
            ISO8String::ISO8String((ISO8String *)local_100,local_a8);
            pSVar9 = local_d8;
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(local_d8->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_property.
                        super_string);
            (pSVar9->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_has_value = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._8_8_ != &local_e8) {
              operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
            }
            pSVar9 = local_d8;
            (local_d8->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
            m_HasValue = *(bool *)&cVar10._M_node[3]._M_left;
            uVar3 = *(undefined8 *)((long)&cVar10._M_node[3]._M_right + 1);
            *(undefined8 *)
             (local_d8->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
             m_Value = *(undefined8 *)((long)&cVar10._M_node[3]._M_left + 1);
            *(undefined8 *)
             ((local_d8->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
              m_Value + 8) = uVar3;
            p_Var12 = (_List_node_base *)operator_new(0x18);
            pIVar4 = local_a0;
            p_Var12[1]._M_next = (_List_node_base *)pSVar9;
            std::__detail::_List_node_base::_M_hook(p_Var12);
            psVar1 = &(pIVar4->
                      super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
          else {
            pSVar9 = *(SoundfieldGroupLabelSubDescriptor **)(iVar8._M_node + 2);
          }
          goto LAB_001a8d05;
        }
        pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar15 = "Not a soundfield group symbol: \'%s\'\n";
      }
      bVar5 = false;
      Kumu::ILogSink::Error(pIVar13,pcVar15,local_d0._M_dataplus._M_p);
      goto LAB_001a9044;
    }
    pSVar9 = local_d8;
    if (local_d8 != (SoundfieldGroupLabelSubDescriptor *)0x0) break;
    pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar15 = "Encountered \'(\', without leading soundfield group symbol.\n";
    goto LAB_001a8f8a;
  case ')':
    if (pSVar9 == (SoundfieldGroupLabelSubDescriptor *)0x0) {
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar15 = "Encountered \')\', not currently processing a soundfield group.\n";
    }
    else {
      if (local_d0._M_string_length != 0) {
        cVar10 = std::
                 _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                 ::find(local_88,&local_d0);
        if (cVar10._M_node != local_90) {
          pAVar11 = (AudioChannelLabelSubDescriptor *)operator_new(0x318);
          AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(pAVar11,local_98);
          Kumu::GenRandomValue(&(pAVar11->super_MCALabelSubDescriptor).MCALinkID);
          (pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_HasValue =
               (pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_HasValue;
          uVar3 = *(undefined8 *)
                   ((pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value +
                   8);
          *(undefined8 *)(pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value =
               *(undefined8 *)
                (pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value;
          *(undefined8 *)
           ((pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value + 8) = uVar3;
          (pAVar11->SoundfieldGroupLinkID).m_has_value = true;
          uVar2 = *local_b0;
          *local_b0 = uVar2 + 1;
          (pAVar11->super_MCALabelSubDescriptor).MCAChannelID.m_property = uVar2 + 1;
          (pAVar11->super_MCALabelSubDescriptor).MCAChannelID.m_has_value = true;
          pcVar14 = "";
          if ((char)cVar10._M_node[3]._M_color != _S_red) {
            pcVar14 = "ch";
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,pcVar14,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (cVar10._M_node + 1));
          UTF16String::operator=
                    (&(pAVar11->super_MCALabelSubDescriptor).MCATagSymbol,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
          ;
          __k = &local_d0;
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar10._M_node + 2));
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(pAVar11->super_MCALabelSubDescriptor).MCATagName.m_property.super_string);
          (pAVar11->super_MCALabelSubDescriptor).MCATagName.m_has_value = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._8_8_ != &local_e8) {
            operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
          }
          ISO8String::ISO8String((ISO8String *)local_100,local_a8);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_property.
                      super_string);
          (pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_has_value = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._8_8_ != &local_e8) {
            operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
          }
          (pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
          m_HasValue = *(bool *)&cVar10._M_node[3]._M_left;
          uVar3 = *(undefined8 *)((long)&cVar10._M_node[3]._M_right + 1);
          *(undefined8 *)
           (pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
               = *(undefined8 *)((long)&cVar10._M_node[3]._M_left + 1);
          *(undefined8 *)
           ((pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
            m_Value + 8) = uVar3;
          p_Var12 = (_List_node_base *)operator_new(0x18);
          pIVar4 = local_a0;
          p_Var12[1]._M_next = (_List_node_base *)pAVar11;
          std::__detail::_List_node_base::_M_hook(p_Var12);
          psVar1 = &(pIVar4->
                    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          pSVar9 = (SoundfieldGroupLabelSubDescriptor *)0x0;
          goto LAB_001a8d05;
        }
        pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
        bVar5 = false;
        Kumu::ILogSink::Error(pIVar13,"Unknown symbol: \'%s\'\n",local_d0._M_dataplus._M_p);
        goto LAB_001a9044;
      }
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar15 = "Soundfield group description contains no channels.\n";
    }
LAB_001a8f8a:
    bVar5 = false;
    Kumu::ILogSink::Error(pIVar13,pcVar15);
    goto LAB_001a9044;
  case '*':
  case '+':
switchD_001a8679_caseD_2a:
    iVar7 = isalnum((int)cVar16);
    if (iVar7 != 0) goto switchD_001a8679_caseD_2d;
    iVar7 = isspace((int)cVar16);
    if (iVar7 == 0) {
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      bVar5 = false;
      Kumu::ILogSink::Error(pIVar13,"Unexpected character \'%c\'.\n",(ulong)(uint)(int)*pcVar15);
      goto LAB_001a9044;
    }
    break;
  case ',':
    if (local_d0._M_string_length != 0) {
      __k = &local_d0;
      iVar7 = std::__cxx11::string::compare((char *)__k);
      if (iVar7 == 0) {
        *local_b0 = *local_b0 + 1;
LAB_001a8d05:
        __k->_M_string_length = 0;
        *(__k->_M_dataplus)._M_p = '\0';
      }
      else if (local_d0._M_string_length != 0) {
        cVar10 = std::
                 _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                 ::find(local_88,&local_d0);
        if (cVar10._M_node == local_90) {
          pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
          pcVar15 = "Unknown symbol: \'%s\'\n";
        }
        else {
          bVar5 = ul_is_an_mca_channel((UL *)&cVar10._M_node[3]._M_parent);
          if (bVar5) {
            pAVar11 = (AudioChannelLabelSubDescriptor *)operator_new(0x318);
            AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(pAVar11,local_98);
            Kumu::GenRandomValue(&(pAVar11->super_MCALabelSubDescriptor).MCALinkID);
            if (pSVar9 != (SoundfieldGroupLabelSubDescriptor *)0x0) {
              (pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_HasValue =
                   (pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_HasValue;
              uVar3 = *(undefined8 *)
                       ((pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.
                        m_Value + 8);
              *(undefined8 *)
               (pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value =
                   *(undefined8 *)
                    (pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value;
              *(undefined8 *)
               ((pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value + 8) =
                   uVar3;
              (pAVar11->SoundfieldGroupLinkID).m_has_value = true;
            }
            uVar2 = *local_b0;
            *local_b0 = uVar2 + 1;
            (pAVar11->super_MCALabelSubDescriptor).MCAChannelID.m_property = uVar2 + 1;
            (pAVar11->super_MCALabelSubDescriptor).MCAChannelID.m_has_value = true;
            pcVar14 = "";
            if ((char)cVar10._M_node[3]._M_color != _S_red) {
              pcVar14 = "ch";
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,pcVar14,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (cVar10._M_node + 1));
            UTF16String::operator=
                      (&(pAVar11->super_MCALabelSubDescriptor).MCATagSymbol,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
            }
            UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar10._M_node + 2));
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(pAVar11->super_MCALabelSubDescriptor).MCATagName.m_property.super_string);
            (pAVar11->super_MCALabelSubDescriptor).MCATagName.m_has_value = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._8_8_ != &local_e8) {
              operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
            }
            if (local_80._M_string_length == 0) {
              ISO8String::ISO8String((ISO8String *)local_100,local_a8);
              std::__cxx11::string::_M_assign
                        ((string *)
                         &(pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_property.
                          super_string);
            }
            else {
              ISO8String::ISO8String((ISO8String *)local_100,&local_80);
              std::__cxx11::string::_M_assign
                        ((string *)
                         &(pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_property.
                          super_string);
            }
            (pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_has_value = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._8_8_ != &local_e8) {
              operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
            }
            (pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
            m_HasValue = *(bool *)&cVar10._M_node[3]._M_left;
            uVar3 = *(undefined8 *)((long)&cVar10._M_node[3]._M_right + 1);
            *(undefined8 *)
             (pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
             m_Value = *(undefined8 *)((long)&cVar10._M_node[3]._M_left + 1);
            *(undefined8 *)
             ((pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
              m_Value + 8) = uVar3;
            p_Var12 = (_List_node_base *)operator_new(0x18);
            pIVar4 = local_a0;
            p_Var12[1]._M_next = (_List_node_base *)pAVar11;
            std::__detail::_List_node_base::_M_hook(p_Var12);
            psVar1 = &(pIVar4->
                      super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            local_d0._M_string_length = 0;
            *local_d0._M_dataplus._M_p = '\0';
            __k = &local_80;
            goto LAB_001a8d05;
          }
          pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
          pcVar15 = "Not a channel symbol: \'%s\'\n";
        }
        bVar5 = false;
        Kumu::ILogSink::Error(pIVar13,pcVar15,local_d0._M_dataplus._M_p);
        goto LAB_001a9044;
      }
    }
    break;
  case '-':
switchD_001a8679_caseD_2d:
    cVar16 = (char)&local_d0;
    if (local_80._M_string_length != 0) {
      iVar7 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar7 == 0) {
        local_80._M_string_length = 0;
        *local_80._M_dataplus._M_p = '\0';
      }
      goto LAB_001a8708;
    }
    goto LAB_001a8714;
  default:
    if (cVar16 != ':') goto switchD_001a8679_caseD_2a;
    iVar7 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar7 != 0) {
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar15 = "Channel specific language may only be used with SLVS tag\n";
      goto LAB_001a8f8a;
    }
LAB_001a8708:
    cVar16 = (char)&local_80;
LAB_001a8714:
    std::__cxx11::string::push_back(cVar16);
  }
  pcVar15 = pcVar15 + 1;
  if (pcVar15 == (s->_M_dataplus)._M_p + s->_M_string_length) goto code_r0x001a8d26;
  goto LAB_001a8661;
code_r0x001a8d26:
  bVar5 = true;
  if (local_d0._M_string_length != 0) {
    iVar7 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar7 == 0) {
      *local_b0 = *local_b0 + 1;
    }
    else if (local_d0._M_string_length != 0) {
      cVar10 = std::
               _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
               ::find(local_88,&local_d0);
      if (cVar10._M_node == local_90) {
        pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar15 = "Unknown symbol: \'%s\'\n";
      }
      else {
        bVar6 = ul_is_an_mca_channel((UL *)&cVar10._M_node[3]._M_parent);
        if (bVar6) {
          pAVar11 = (AudioChannelLabelSubDescriptor *)operator_new(0x318);
          AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(pAVar11,local_98);
          Kumu::GenRandomValue(&(pAVar11->super_MCALabelSubDescriptor).MCALinkID);
          if (pSVar9 != (SoundfieldGroupLabelSubDescriptor *)0x0) {
            (pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_HasValue =
                 (pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_HasValue;
            uVar3 = *(undefined8 *)
                     ((pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value
                     + 8);
            *(undefined8 *)(pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value
                 = *(undefined8 *)
                    (pSVar9->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value;
            *(undefined8 *)
             ((pAVar11->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value + 8) = uVar3
            ;
            (pAVar11->SoundfieldGroupLinkID).m_has_value = true;
          }
          uVar2 = *local_b0;
          *local_b0 = uVar2 + 1;
          (pAVar11->super_MCALabelSubDescriptor).MCAChannelID.m_property = uVar2 + 1;
          (pAVar11->super_MCALabelSubDescriptor).MCAChannelID.m_has_value = true;
          pcVar15 = "";
          if ((char)cVar10._M_node[3]._M_color != _S_red) {
            pcVar15 = "ch";
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,pcVar15,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (cVar10._M_node + 1));
          UTF16String::operator=
                    (&(pAVar11->super_MCALabelSubDescriptor).MCATagSymbol,(string *)local_100);
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar10._M_node + 2));
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(pAVar11->super_MCALabelSubDescriptor).MCATagName.m_property.super_string);
          (pAVar11->super_MCALabelSubDescriptor).MCATagName.m_has_value = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._8_8_ != &local_e8) {
            operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
          }
          ISO8String::ISO8String((ISO8String *)local_100,local_a8);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_property.
                      super_string);
          (pAVar11->super_MCALabelSubDescriptor).RFC5646SpokenLanguage.m_has_value = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._8_8_ != &local_e8) {
            operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
          }
          (pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
          m_HasValue = *(bool *)&cVar10._M_node[3]._M_left;
          uVar3 = *(undefined8 *)((long)&cVar10._M_node[3]._M_right + 1);
          *(undefined8 *)
           (pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
               = *(undefined8 *)((long)&cVar10._M_node[3]._M_left + 1);
          *(undefined8 *)
           ((pAVar11->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
            m_Value + 8) = uVar3;
          p_Var12 = (_List_node_base *)operator_new(0x18);
          pIVar4 = local_a0;
          p_Var12[1]._M_next = (_List_node_base *)pAVar11;
          std::__detail::_List_node_base::_M_hook(p_Var12);
          psVar1 = &(pIVar4->
                    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          goto LAB_001a9044;
        }
        pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar15 = "Not a channel symbol: \'%s\'\n";
      }
      bVar5 = false;
      Kumu::ILogSink::Error(pIVar13,pcVar15,local_d0._M_dataplus._M_p);
    }
  }
LAB_001a9044:
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool
ASDCP::MXF::decode_mca_string(const std::string& s, const mca_label_map_t& labels, const Dictionary* dict, const std::string& language,
			      InterchangeObject_list_t& descriptor_list, ui32_t& channel_count)
{
  typedef std::map<const std::string, ASDCP::MXF::SoundfieldGroupLabelSubDescriptor *, ci_comp> sfg_map_t;
  std::string symbol_buf;
  std::string current_language;
  channel_count = 0;
  ASDCP::MXF::SoundfieldGroupLabelSubDescriptor *current_soundfield = 0, *prev_soundfield = 0;
  std::string::const_iterator i;
  sfg_map_t used_soundfields; /* Track old soundfields, so that they can be reused. This allows
                                 for the following type of layout:
                                 71(L,R,C,LFE,Lss,Rss),HI,VIN,-,-,71(Lrs,Rrs),DBOX,-  */

  for ( i = s.begin(); i != s.end(); ++i )
    {
      if ( *i == '(' )
	{
	  if ( current_soundfield != 0 && symbol_buf.empty() )
	    {
	      // appending to the existing soundfield group
	      continue;
	    }
	  else if ( current_soundfield != 0 )
	    {
	      DefaultLogSink().Error("Encountered '(', already processing a soundfield group.\n");
	      return false;
	    }
	  else if ( symbol_buf.empty() )
	    {
	      if ( prev_soundfield != 0 )
		{
		  current_soundfield = prev_soundfield;
		  // appending to the existing soundfield group
		  continue;
		}
	      else
		{
		  DefaultLogSink().Error("Encountered '(', without leading soundfield group symbol.\n");
		  return false;
		}
	    }

	  mca_label_map_t::const_iterator i = labels.find(symbol_buf);

	  if ( i == labels.end() )
	    {
	      DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }
      
	  if ( ! ul_is_an_mca_group(i->second.ul) )
	    {
	      DefaultLogSink().Error("Not a soundfield group symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }

	  sfg_map_t::const_iterator ui = used_soundfields.find(symbol_buf);
	  if ( ui != used_soundfields.end() )
	    {
	      current_soundfield = ui->second;  // reuse the old soundfield.
	    }
	  else
	    {
	      current_soundfield = new ASDCP::MXF::SoundfieldGroupLabelSubDescriptor(dict);
	      GenRandomValue(current_soundfield->MCALinkID);

	      current_soundfield->MCATagSymbol = (i->second.requires_prefix ? "sg" : "") + i->first;
	      current_soundfield->MCATagName = i->second.tag_name;
	      current_soundfield->RFC5646SpokenLanguage = language;
	      current_soundfield->MCALabelDictionaryID = i->second.ul;
	      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(current_soundfield));
	      prev_soundfield = current_soundfield;
	    }
	  symbol_buf.clear();
	}
      else if ( *i == ')' )
	{
	  if ( current_soundfield == 0 )
	    {
	      DefaultLogSink().Error("Encountered ')', not currently processing a soundfield group.\n");
	      return false;
	    }

	  if ( symbol_buf.empty() )
	    {
	      DefaultLogSink().Error("Soundfield group description contains no channels.\n");
	      return false;
	    }

	  mca_label_map_t::const_iterator i = labels.find(symbol_buf);
      
	  if ( i == labels.end() )
	    {
	      DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }

	  assert(current_soundfield);

	  ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
	    new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
	  GenRandomValue(channel_descr->MCALinkID);

	  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
	  channel_descr->MCAChannelID = channel_count++ + 1;
	  channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
	  channel_descr->MCATagName = i->second.tag_name;
	  channel_descr->RFC5646SpokenLanguage = language;
	  channel_descr->MCALabelDictionaryID = i->second.ul;
	  descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
	  symbol_buf.clear();
	  current_soundfield = 0;
	}
      else if ( *i == ':' )
        {
          // Limits the usage to the SLVS channel, but can easily be extended to set individual languages, or soundfield group languages
          if ( symbol_buf.compare("SLVS") != 0 ) {
            DefaultLogSink().Error("Channel specific language may only be used with SLVS tag\n");
            return false;
          }
          current_language += *i;
        }
      else if ( *i == ',' )
	{
	  if ( ! symbol_buf.empty() && ! symbol_buf.compare("-") )
	    {
	      channel_count++;
	      symbol_buf.clear();
	    }
	  else if ( ! symbol_buf.empty() )
	    {
	      mca_label_map_t::const_iterator i = labels.find(symbol_buf);

	      if ( i == labels.end() )
		{
		  DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
		  return false;
		}

	      if ( ! ul_is_an_mca_channel(i->second.ul) )
		{
		  DefaultLogSink().Error("Not a channel symbol: '%s'\n", symbol_buf.c_str());
		  return false;
		}

	      ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
		new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
	      GenRandomValue(channel_descr->MCALinkID);

	      if ( current_soundfield != 0 )
		{
		  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
		}

	      channel_descr->MCAChannelID = channel_count++ + 1;
	      channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
	      channel_descr->MCATagName = i->second.tag_name;
              if ( current_language.empty() )
                {
        	  channel_descr->RFC5646SpokenLanguage = language;
                }
              else
                {
                  channel_descr->RFC5646SpokenLanguage = current_language;
                }
	      channel_descr->MCALabelDictionaryID = i->second.ul;
	      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
	      symbol_buf.clear();
              current_language.clear();
	    }
	}
      else if ( *i == '-' || isalnum(*i) )
	{
          if ( ! current_language.empty() ) 
            {
              if ( current_language.compare(":") == 0)
                {
                  current_language.clear();
                }
              current_language += *i;
            }
          else
            {
	      symbol_buf += *i;
            }
	}
      else if ( ! isspace(*i) )
	{
	  DefaultLogSink().Error("Unexpected character '%c'.\n", *i);
	  return false;
	}
    }

  if ( ! symbol_buf.empty() && ! symbol_buf.compare("-")  )
    {
      channel_count++;
    }
  else if ( ! symbol_buf.empty() )
    {
      mca_label_map_t::const_iterator i = labels.find(symbol_buf);
      
      if ( i == labels.end() )
	{
	  DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	  return false;
	}

      if ( ! ul_is_an_mca_channel(i->second.ul) )
	{
	  DefaultLogSink().Error("Not a channel symbol: '%s'\n", symbol_buf.c_str());
	  return false;
	}

      ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
	new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
      GenRandomValue(channel_descr->MCALinkID);

      if ( current_soundfield != 0 )
	{
	  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
	}

      channel_descr->MCAChannelID = channel_count++ + 1;
      channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
      channel_descr->MCATagName = i->second.tag_name;
      channel_descr->RFC5646SpokenLanguage = language;
      channel_descr->MCALabelDictionaryID = i->second.ul;
      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
    }

  return true;
}